

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_mean(ggml_context *ctx,ggml_tensor *a)

{
  ggml_tensor *pgVar1;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  int ne [4];
  _Bool is_node;
  undefined8 in_stack_ffffffffffffffc8;
  ggml_context *in_stack_ffffffffffffffd0;
  
  if (in_RSI->grad == (ggml_tensor *)0x0) {
    pgVar1 = ggml_new_tensor(in_stack_ffffffffffffffd0,
                             (ggml_type)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                             (int)in_stack_ffffffffffffffc8,(int *)0x14b7f9);
    pgVar1->op = GGML_OP_MEAN;
    pgVar1->grad = (ggml_tensor *)0x0;
    pgVar1->src0 = in_RSI;
    pgVar1->src1 = (ggml_tensor *)0x0;
    return pgVar1;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xcea,
          "false");
  abort();
}

Assistant:

struct ggml_tensor * ggml_mean(
        struct ggml_context * ctx,
        struct ggml_tensor * a) {
    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement
        is_node = true;
    }

    int ne[GGML_MAX_DIMS] = { 1, a->ne[1], a->ne[2], a->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, a->n_dims, ne);

    result->op   = GGML_OP_MEAN;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}